

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall
QNetworkProxy::setRawHeader(QNetworkProxy *this,QByteArray *headerName,QByteArray *headerValue)

{
  QNetworkProxyPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  if (pQVar1->type != HttpProxy) {
    pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
    if (pQVar1->type != HttpCachingProxy) {
      return;
    }
  }
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  QNetworkHeadersPrivate::setRawHeader(&pQVar1->headers,headerName,headerValue);
  return;
}

Assistant:

void QNetworkProxy::setRawHeader(const QByteArray &headerName, const QByteArray &headerValue)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setRawHeader(headerName, headerValue);
}